

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O3

_Bool effect_handler_BALL(effect_handler_context_t *context)

{
  anon_enum_32 aVar1;
  _Bool _Var2;
  wchar_t dam;
  wchar_t wVar3;
  uint32_t uVar4;
  monster *mon;
  monster *pmVar5;
  int iVar6;
  wchar_t rad;
  source origin;
  loc target;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  rad = L'\x02';
  if (context->radius != L'\0') {
    rad = context->radius;
  }
  target = (loc)loc(-1,-1);
  aVar1 = (context->origin).what;
  if (aVar1 == SRC_TRAP) {
    target = ((context->origin).which.trap)->grid;
    wVar3 = L'ࡼ';
    goto LAB_00139e6f;
  }
  if (aVar1 != SRC_PLAYER) {
    wVar3 = L'|';
    if (aVar1 == SRC_MONSTER) {
      mon = cave_monster(cave,(context->origin).which.monster);
      pmVar5 = monster_target_monster((effect_handler_context_t_conflict *)context);
      if (mon == (monster *)0x0) {
        __assert_fail("mon",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-attack.c"
                      ,0x261,"_Bool effect_handler_BALL(effect_handler_context_t *)");
      }
      wVar3 = monster_effect_level(mon,L'\x02');
      iVar6 = 100;
      for (; wVar3 != L'\0'; wVar3 = wVar3 + L'\xffffffff') {
        iVar6 = (iVar6 * 0x3c) / 100;
      }
      _Var2 = monster_is_powerful(mon);
      rad = rad + (uint)_Var2;
      uVar4 = Rand_div(100);
      if ((int)uVar4 < iVar6) {
        if (pmVar5 == (monster *)0x0) {
          _Var2 = monster_is_decoyed(mon);
          if (_Var2) {
            target = cave_find_decoy(cave);
          }
          else {
            target.x = (player->grid).x;
            target.y = (player->grid).y;
          }
        }
        else {
          target.x = (pmVar5->grid).x;
          target.y = (pmVar5->grid).y;
        }
      }
      else {
        uVar4 = Rand_div(9);
        target = (loc)loc_sum(mon->grid,(loc_conflict)ddgrid[(long)(int)uVar4 + 1]);
      }
      wVar3 = L'ࡰ';
    }
    goto LAB_00139e6f;
  }
  wVar3 = context->dir;
  if (wVar3 == L'\x05') {
    _Var2 = target_okay();
    if (!_Var2) {
      wVar3 = context->dir;
      goto LAB_00139e2a;
    }
    target_get((loc_conflict *)&target);
    wVar3 = L'p';
  }
  else {
LAB_00139e2a:
    target = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[wVar3]);
    wVar3 = L'|';
  }
  if (context->other != L'\0') {
    rad = rad + (int)player->lev / context->other;
  }
LAB_00139e6f:
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var2 = project(origin,rad,target,dam,context->subtype,wVar3,L'\0','\0',context->obj);
  if (_Var2) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_BALL(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int rad = context->radius ? context->radius : 2;
	struct loc target = loc(-1, -1);

	int flg = PROJECT_THRU | PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Player or monster? */
	switch (context->origin.what) {
		case SRC_MONSTER: {
			struct monster *mon = cave_monster(cave, context->origin.which.monster);
			int conf_level, accuracy = 100;
			struct monster *t_mon = monster_target_monster(context);

			assert(mon);

			conf_level = monster_effect_level(mon, MON_TMD_CONF);
			while (conf_level) {
				accuracy *= (100 - CONF_RANDOM_CHANCE);
				accuracy /= 100;
				conf_level--;
			}

			/* Powerful monster */
			if (monster_is_powerful(mon)) {
				rad++;
			}

			flg |= PROJECT_PLAY;
			flg &= ~(PROJECT_STOP | PROJECT_THRU);

			if (randint1(100) > accuracy) {
				/* Confused direction */
				int dir = randint1(9);
				target = loc_sum(mon->grid, ddgrid[dir]);
			} else if (t_mon) {
				/* Target monster */
				target = t_mon->grid;
			} else {
				/* Target player */
				if (monster_is_decoyed(mon)) {
					target = cave_find_decoy(cave);
				} else {
					target = player->grid;
				}
			}

			break;
		}

		case SRC_TRAP: {
			struct trap *trap = context->origin.which.trap;
			flg |= PROJECT_PLAY;
			target = trap->grid;
			break;
		}

		case SRC_PLAYER:
			/* Ask for a target if no direction given */
			if (context->dir == DIR_TARGET && target_okay()) {
				flg &= ~(PROJECT_STOP | PROJECT_THRU);
				target_get(&target);
			} else {
				target = loc_sum(player->grid, ddgrid[context->dir]);
			}

			if (context->other) rad += player->lev / context->other;
			break;

		default:
			break;
	}

	/* Aim at the target, explode */
	if (project(context->origin, rad, target, dam, context->subtype, flg, 0, 0, context->obj))
		context->ident = true;

	return true;
}